

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t *
roaring_bitmap_flip_closed(roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  uint16_t hb;
  uint16_t *puVar2;
  rle16_t *prVar3;
  uint8_t uVar4;
  _Bool _Var5;
  uint uVar6;
  int iVar7;
  roaring_bitmap_t *prVar8;
  roaring_array_t *ra;
  run_container_t *run;
  run_container_t *c;
  uint16_t lb_start;
  uint16_t stopping_key;
  uint uVar9;
  uint8_t uVar10;
  array_container_t *src;
  ushort key;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  run_container_t *local_38;
  
  if (range_end < range_start) {
    prVar8 = roaring_bitmap_copy(x1);
    return prVar8;
  }
  ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar11 = range_start >> 0x10;
  stopping_key = (uint16_t)(range_start >> 0x10);
  ra_append_copies_until
            (ra,&x1->high_low_container,stopping_key,(_Bool)((x1->high_low_container).flags & 1));
  lb_start = (uint16_t)range_start;
  hb = (uint16_t)(range_end >> 0x10);
  if (uVar11 == range_end >> 0x10) {
    insert_flipped_container(ra,&x1->high_low_container,stopping_key,lb_start,(uint16_t)range_end);
  }
  else {
    if (lb_start != 0) {
      insert_flipped_container(ra,&x1->high_low_container,stopping_key,lb_start,0xffff);
      uVar11 = uVar11 + 1 & 0xffff;
    }
    uVar9 = (range_end >> 0x10) - (uint)((range_end & 0xffff) != 0xffff) & 0xffff;
    if (uVar11 <= uVar9) {
      do {
        iVar7 = (x1->high_low_container).size;
        key = (ushort)uVar11;
        if (((long)iVar7 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar7 + -1] == key)) {
          uVar6 = iVar7 - 1;
        }
        else if (iVar7 < 1) {
          uVar6 = 0xffffffff;
        }
        else {
          iVar7 = iVar7 + -1;
          uVar12 = 0;
          do {
            uVar6 = iVar7 + uVar12 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar7 + uVar12 & 0xfffffffe));
            if (uVar1 < key) {
              uVar12 = uVar6 + 1;
            }
            else {
              if (uVar1 <= key) goto LAB_00108875;
              iVar7 = uVar6 - 1;
            }
          } while ((int)uVar12 <= iVar7);
          uVar6 = ~uVar12;
        }
LAB_00108875:
        iVar7 = ra->size;
        if (((long)iVar7 == 0) || (ra->keys[(long)iVar7 + -1] == key)) {
          uVar12 = iVar7 - 1;
        }
        else if (iVar7 < 1) {
          uVar12 = 0xffffffff;
        }
        else {
          iVar7 = iVar7 + -1;
          uVar13 = 0;
          do {
            uVar12 = iVar7 + uVar13 >> 1;
            uVar1 = *(ushort *)((long)ra->keys + (ulong)(iVar7 + uVar13 & 0xfffffffe));
            if (uVar1 < key) {
              uVar13 = uVar12 + 1;
            }
            else {
              if (uVar1 <= key) goto LAB_00108890;
              iVar7 = uVar12 - 1;
            }
          } while ((int)uVar13 <= iVar7);
          uVar12 = ~uVar13;
        }
LAB_00108890:
        if ((int)uVar6 < 0) {
          c = run_container_create_given_capacity(1);
          if (c != (run_container_t *)0x0) {
            prVar3 = c->runs;
            iVar7 = c->n_runs;
            prVar3[iVar7].value = 0;
            prVar3[iVar7].length = 0xffff;
            c->n_runs = c->n_runs + 1;
          }
          uVar4 = '\x03';
LAB_00108a15:
          ra_insert_new_key_value_at(ra,~uVar12,key,c,uVar4);
        }
        else {
          uVar4 = (x1->high_low_container).typecodes[uVar6 & 0xffff];
          src = (array_container_t *)(x1->high_low_container).containers[uVar6 & 0xffff];
          if (uVar4 == '\x04') {
            uVar4 = *(uint8_t *)&src->array;
            src = *(array_container_t **)src;
          }
          local_38 = (run_container_t *)0x0;
          if (uVar4 == '\x03') {
            iVar7 = run_container_negation((run_container_t *)src,&local_38);
            uVar10 = (uint8_t)iVar7;
            run = local_38;
            c = local_38;
            uVar4 = uVar10;
            if (uVar10 == '\x04') {
              uVar10 = *(uint8_t *)&local_38->runs;
              run = *(run_container_t **)local_38;
              uVar4 = '\x04';
            }
          }
          else if (uVar4 == '\x02') {
            run = (run_container_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)run);
            uVar10 = '\x01';
            c = run;
            uVar4 = uVar10;
          }
          else {
            _Var5 = bitset_container_negation((bitset_container_t *)src,&local_38);
            uVar10 = '\x02' - _Var5;
            run = local_38;
            c = local_38;
            uVar4 = uVar10;
          }
          if (uVar10 == '\x03') {
            iVar7 = run_container_cardinality(run);
          }
          else {
            iVar7 = run->n_runs;
          }
          if (iVar7 != 0) goto LAB_00108a15;
          container_free(c,uVar4);
        }
        bVar14 = uVar11 != uVar9;
        uVar11 = uVar11 + 1;
      } while (bVar14);
    }
    if ((range_end & 0xffff) != 0xffff) {
      insert_flipped_container(ra,&x1->high_low_container,hb,0,(uint16_t)range_end);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip_closed(const roaring_bitmap_t *x1,
                                             uint32_t range_start,
                                             uint32_t range_end) {
    if (range_start > range_end) {
        return roaring_bitmap_copy(x1);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}